

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMakeReady(Vdbe *p,Parse *pParse)

{
  short sVar1;
  int iVar2;
  int iVar3;
  sqlite3 *db_00;
  uint uVar4;
  Mem *pMVar5;
  Mem **ppMVar6;
  VdbeCursor **ppVVar7;
  u8 *n_00;
  Vdbe *in_RSI;
  Vdbe *in_RDI;
  ReusableSpace x;
  int n;
  int nArg;
  int nCursor;
  int nMem;
  int nVar;
  sqlite3 *db;
  bool local_41;
  uint uVar8;
  int local_20;
  sqlite3 *db_01;
  
  db_01 = in_RDI->db;
  sVar1 = (short)in_RSI->nFrame;
  iVar2 = in_RSI->pc;
  iVar3 = *(int *)&in_RSI->aColName;
  local_20 = iVar2 + in_RSI->rc;
  if ((iVar2 == 0) && (0 < local_20)) {
    local_20 = local_20 + 1;
  }
  n_00 = &in_RDI->aOp->opcode + in_RDI->nOp * 0x18;
  uVar4 = in_RSI->iStatement + in_RDI->nOp * -0x18 & 0xfffffff8;
  resolveP2Values(in_RSI,(int *)db_01);
  local_41 = false;
  if ((char)in_RSI->nVar != '\0') {
    local_41 = *(char *)((long)&in_RSI->nVar + 1) != '\0';
  }
  *(ushort *)&in_RDI->field_0xc1 = *(ushort *)&in_RDI->field_0xc1 & 0xff7f | (ushort)local_41 << 7;
  if ((*(char *)((long)&in_RSI->nFrame + 3) != '\0') && (local_20 < 10)) {
    local_20 = 10;
  }
  *(ushort *)&in_RDI->field_0xc1 = *(ushort *)&in_RDI->field_0xc1 & 0xfffc;
  do {
    uVar8 = 0;
    pMVar5 = (Mem *)allocSpace((ReusableSpace *)&stack0xffffffffffffffc0,in_RDI->aMem,
                               local_20 * 0x38);
    in_RDI->aMem = pMVar5;
    pMVar5 = (Mem *)allocSpace((ReusableSpace *)&stack0xffffffffffffffc0,in_RDI->aVar,sVar1 * 0x38);
    in_RDI->aVar = pMVar5;
    ppMVar6 = (Mem **)allocSpace((ReusableSpace *)&stack0xffffffffffffffc0,in_RDI->apArg,iVar3 << 3)
    ;
    in_RDI->apArg = ppMVar6;
    ppVVar7 = (VdbeCursor **)
              allocSpace((ReusableSpace *)&stack0xffffffffffffffc0,in_RDI->apCsr,iVar2 << 3);
    in_RDI->apCsr = ppVVar7;
    if (uVar8 == 0) break;
    db_00 = (sqlite3 *)CONCAT44(uVar8,uVar4);
    uVar4 = uVar8;
    n_00 = (u8 *)sqlite3DbMallocRawNN(db_00,(u64)n_00);
    in_RDI->pFree = n_00;
  } while (db_01->mallocFailed == '\0');
  in_RDI->pVList = (VList *)in_RSI[1].db;
  in_RSI[1].db = (sqlite3 *)0x0;
  *(ushort *)&in_RDI->field_0xc1 =
       *(ushort *)&in_RDI->field_0xc1 & 0xfff3 | (*(byte *)((long)&in_RSI->nFrame + 3) & 3) << 2;
  if (db_01->mallocFailed == '\0') {
    in_RDI->nCursor = iVar2;
    in_RDI->nVar = sVar1;
    initMemArray(in_RDI->aVar,(int)sVar1,db_01,1);
    in_RDI->nMem = local_20;
    initMemArray(in_RDI->aMem,local_20,db_01,0x80);
    memset(in_RDI->apCsr,0,(long)iVar2 << 3);
  }
  else {
    in_RDI->nVar = 0;
    in_RDI->nCursor = 0;
    in_RDI->nMem = 0;
  }
  sqlite3VdbeRewind(in_RDI);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMakeReady(
  Vdbe *p,                       /* The VDBE */
  Parse *pParse                  /* Parsing context */
){
  sqlite3 *db;                   /* The database connection */
  int nVar;                      /* Number of parameters */
  int nMem;                      /* Number of VM memory registers */
  int nCursor;                   /* Number of cursors required */
  int nArg;                      /* Number of arguments in subprograms */
  int n;                         /* Loop counter */
  struct ReusableSpace x;        /* Reusable bulk memory */

  assert( p!=0 );
  assert( p->nOp>0 );
  assert( pParse!=0 );
  assert( p->magic==VDBE_MAGIC_INIT );
  assert( pParse==p->pParse );
  db = p->db;
  assert( db->mallocFailed==0 );
  nVar = pParse->nVar;
  nMem = pParse->nMem;
  nCursor = pParse->nTab;
  nArg = pParse->nMaxArg;
  
  /* Each cursor uses a memory cell.  The first cursor (cursor 0) can
  ** use aMem[0] which is not otherwise used by the VDBE program.  Allocate
  ** space at the end of aMem[] for cursors 1 and greater.
  ** See also: allocateCursor().
  */
  nMem += nCursor;
  if( nCursor==0 && nMem>0 ) nMem++;  /* Space for aMem[0] even if not used */

  /* Figure out how much reusable memory is available at the end of the
  ** opcode array.  This extra memory will be reallocated for other elements
  ** of the prepared statement.
  */
  n = ROUND8(sizeof(Op)*p->nOp);              /* Bytes of opcode memory used */
  x.pSpace = &((u8*)p->aOp)[n];               /* Unused opcode memory */
  assert( EIGHT_BYTE_ALIGNMENT(x.pSpace) );
  x.nFree = ROUNDDOWN8(pParse->szOpAlloc - n);  /* Bytes of unused memory */
  assert( x.nFree>=0 );
  assert( EIGHT_BYTE_ALIGNMENT(&x.pSpace[x.nFree]) );

  resolveP2Values(p, &nArg);
  p->usesStmtJournal = (u8)(pParse->isMultiWrite && pParse->mayAbort);
  if( pParse->explain && nMem<10 ){
    nMem = 10;
  }
  p->expired = 0;

  /* Memory for registers, parameters, cursor, etc, is allocated in one or two
  ** passes.  On the first pass, we try to reuse unused memory at the 
  ** end of the opcode array.  If we are unable to satisfy all memory
  ** requirements by reusing the opcode array tail, then the second
  ** pass will fill in the remainder using a fresh memory allocation.  
  **
  ** This two-pass approach that reuses as much memory as possible from
  ** the leftover memory at the end of the opcode array.  This can significantly
  ** reduce the amount of memory held by a prepared statement.
  */
  do {
    x.nNeeded = 0;
    p->aMem = allocSpace(&x, p->aMem, nMem*sizeof(Mem));
    p->aVar = allocSpace(&x, p->aVar, nVar*sizeof(Mem));
    p->apArg = allocSpace(&x, p->apArg, nArg*sizeof(Mem*));
    p->apCsr = allocSpace(&x, p->apCsr, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
    p->anExec = allocSpace(&x, p->anExec, p->nOp*sizeof(i64));
#endif
    if( x.nNeeded==0 ) break;
    x.pSpace = p->pFree = sqlite3DbMallocRawNN(db, x.nNeeded);
    x.nFree = x.nNeeded;
  }while( !db->mallocFailed );

  p->pVList = pParse->pVList;
  pParse->pVList =  0;
  p->explain = pParse->explain;
  if( db->mallocFailed ){
    p->nVar = 0;
    p->nCursor = 0;
    p->nMem = 0;
  }else{
    p->nCursor = nCursor;
    p->nVar = (ynVar)nVar;
    initMemArray(p->aVar, nVar, db, MEM_Null);
    p->nMem = nMem;
    initMemArray(p->aMem, nMem, db, MEM_Undefined);
    memset(p->apCsr, 0, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
    memset(p->anExec, 0, p->nOp*sizeof(i64));
#endif
  }
  sqlite3VdbeRewind(p);
}